

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::
strTree<kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[30],kj::StringPtr&,char_const(&)[365],kj::StringTree,kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[348]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char (*params_1) [7],
          StringPtr *params_2,char (*params_3) [30],StringPtr *params_4,char (*params_5) [365],
          StringTree *params_6,StringTree *params_7,Array<kj::StringTree> *params_8,
          char (*params_9) [348])

{
  ArrayPtr<const_char> *params_9_00;
  ArrayPtr<const_char> local_c8;
  ArrayPtr<const_char> local_b8;
  ArrayPtr<const_char> local_a8;
  ArrayPtr<const_char> local_98;
  ArrayPtr<const_char> local_88;
  ArrayPtr<const_char> local_78;
  StringTree local_68;
  
  local_88 = toCharSequence<char_const(&)[7]>((char (*) [7])params);
  local_98.ptr = *(char **)params_1;
  local_98.size_ = *(long *)(params_1[1] + 1) - 1;
  local_a8 = toCharSequence<char_const(&)[30]>((char (*) [30])params_2);
  local_b8.ptr = *(char **)*params_3;
  local_b8.size_ = *(long *)(*params_3 + 8) - 1;
  local_c8 = toCharSequence<char_const(&)[365]>((char (*) [365])params_4);
  operator*(&local_68,params_7);
  params_9_00 = (ArrayPtr<const_char> *)0x16753c;
  local_78 = toCharSequence<char_const(&)[348]>((char (*) [348])params_8);
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)this,(StringTree *)&local_88,&local_98,&local_a8,
             &local_b8,&local_c8,(ArrayPtr<const_char> *)params_5,params_6,&local_68,
             (StringTree *)&local_78,params_9_00);
  StringTree::~StringTree(&local_68);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}